

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockResult.cxx
# Opt level: O2

string * __thiscall
cmFileLockResult::GetOutputMessage_abi_cxx11_(string *__return_storage_ptr__,cmFileLockResult *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(this->Type) {
  case OK:
    pcVar2 = "0";
    paVar1 = &local_9;
    break;
  case SYSTEM:
    pcVar2 = strerror(this->ErrorValue);
    paVar1 = &local_a;
    break;
  case TIMEOUT:
    pcVar2 = "Timeout reached";
    paVar1 = &local_b;
    break;
  case ALREADY_LOCKED:
    pcVar2 = "File already locked";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "Internal error";
    paVar1 = &local_e;
    break;
  case NO_FUNCTION:
    pcVar2 = "\'GUARD FUNCTION\' not used in function definition";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileLockResult::GetOutputMessage() const
{
  switch (this->Type)
    {
    case OK:
      return "0";
    case SYSTEM:
#if defined(_WIN32)
      {
      char* errorText = NULL;

      // http://stackoverflow.com/a/455533/2288008
      DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM |
          FORMAT_MESSAGE_ALLOCATE_BUFFER |
          FORMAT_MESSAGE_IGNORE_INSERTS;
      ::FormatMessageA(
          flags,
          NULL,
          this->ErrorValue,
          MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
          (LPSTR)&errorText,
          0,
          NULL
      );

      if (errorText != NULL)
        {
        const std::string message = errorText;
        ::LocalFree(errorText);
        return message;
        }
      else
        {
        return "Internal error (FormatMessageA failed)";
        }
      }
#else
      return strerror(this->ErrorValue);
#endif
    case TIMEOUT:
      return "Timeout reached";
    case ALREADY_LOCKED:
      return "File already locked";
    case NO_FUNCTION:
      return "'GUARD FUNCTION' not used in function definition";
    case INTERNAL:
    default:
      return "Internal error";
    }
}